

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecCall(Parser *this)

{
  line_t *plVar1;
  _func_int *p_Var2;
  pointer pcVar3;
  Expr EVar4;
  undefined1 auVar5 [8];
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  _Alloc_hider _Var9;
  Expr EVar10;
  ParseError *__return_storage_ptr__;
  long *plVar11;
  CompileContext *pCVar12;
  Parser *in_RSI;
  pointer *__ptr;
  Token dot;
  Token name;
  vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
  args;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  undefined1 local_f0 [8];
  undefined1 auStack_e8 [24];
  _Alloc_hider local_d0;
  _Alloc_hider local_c8;
  undefined1 local_c0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_50;
  
  parsePrecPrimary(this);
  plVar1 = &(in_RSI->m_previous).line;
  local_a8._8_8_ = this;
  while( true ) {
    while ((in_RSI->m_current).type != LEFT_PAREN) {
      if ((in_RSI->m_current).type != DOT) {
        return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
               (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
      }
      advance(in_RSI);
      local_100._0_4_ = (in_RSI->m_previous).type;
      local_f8._M_p = local_f0 + 8;
      pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length);
      auStack_e8._20_2_ = (in_RSI->m_previous).col;
      auStack_e8._16_4_ = *plVar1;
      local_d0._M_p = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Expected property name after \'.\'.","");
      expect(in_RSI,IDENTIFIER,(string *)&local_d0);
      if (local_d0._M_p != local_c0) {
        operator_delete(local_d0._M_p,(ulong)((long)local_c0 + 1));
      }
      local_d0._M_p._0_4_ = (in_RSI->m_previous).type;
      local_c8._M_p = local_c0 + 8;
      pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length);
      local_a8._M_allocated_capacity._4_2_ = (in_RSI->m_previous).col;
      local_a8._M_allocated_capacity._0_4_ = *plVar1;
      std::
      make_unique<enact::FieldExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token,enact::Token>
                ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&local_78,
                 (Token *)this,(Token *)&local_d0);
      _Var9._M_p = local_78._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)0x0;
      plVar11 = *(long **)this;
      *(pointer *)this = _Var9._M_p;
      if (plVar11 != (long *)0x0) {
        (**(code **)(*plVar11 + 8))();
      }
      if ((_Hash_node_base *)local_78._M_dataplus._M_p != (_Hash_node_base *)0x0) {
        (*(code *)(*(_Hash_node_base **)local_78._M_dataplus._M_p)[1]._M_nxt)();
      }
      if (local_c8._M_p != local_c0 + 8) {
        operator_delete(local_c8._M_p,
                        CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1)
        ;
      }
      if (local_f8._M_p != local_f0 + 8) {
        operator_delete(local_f8._M_p,auStack_e8._0_8_ + 1);
      }
    }
    advance(in_RSI);
    local_98.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((in_RSI->m_current).type != RIGHT_PAREN) {
      while( true ) {
        parseExpr((Parser *)local_100);
        std::
        vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
        ::emplace_back<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
                  ((vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
                    *)&local_98,
                   (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_100);
        if (local_100 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_100 + 8))();
        }
        if ((in_RSI->m_current).type != COMMA) break;
        advance(in_RSI);
      }
    }
    local_100 = (undefined1  [8])local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"Expected \')\' after function call arguments.","");
    expect(in_RSI,RIGHT_PAREN,(string *)local_100);
    if (local_100 != (undefined1  [8])local_f0) {
      operator_delete((void *)local_100,(ulong)((long)local_f0 + 1));
    }
    local_d0._M_p._0_4_ = (in_RSI->m_previous).type;
    local_c8._M_p = local_c0 + 8;
    pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length);
    puVar7 = local_98.
             super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar6 = local_98.
             super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a8._M_allocated_capacity._4_2_ = (in_RSI->m_previous).col;
    local_a8._M_allocated_capacity._0_4_ = *plVar1;
    if (0x7f8 < (ulong)((long)local_98.
                              super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_98.
                             super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)) break;
    EVar10._vptr_Expr = (_func_int **)operator_new(0x58);
    puVar8 = local_98.
             super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    this = (Parser *)local_a8._8_8_;
    auVar5 = local_c0;
    EVar4._vptr_Expr = *(_func_int ***)local_a8._8_8_;
    *(_func_int ***)local_a8._8_8_ = (_func_int **)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100._0_4_ = (TokenType)local_d0._M_p;
    p_Var2 = (_func_int *)(local_f0 + 8);
    if (local_c8._M_p == local_c0 + 8) {
      auStack_e8._8_8_ = local_b8._8_8_;
      local_f8._M_p = (pointer)p_Var2;
    }
    else {
      local_f8._M_p = local_c8._M_p;
    }
    auStack_e8._1_7_ = local_b8._M_allocated_capacity._1_7_;
    auStack_e8[0] = local_b8._M_local_buf[0];
    local_c0 = (undefined1  [8])0x0;
    local_b8._M_local_buf[0] = '\0';
    auStack_e8._20_2_ = (in_RSI->m_previous).col;
    auStack_e8._16_4_ = *plVar1;
    *EVar10._vptr_Expr = (_func_int *)&PTR__CallExpr_001296c0;
    EVar10._vptr_Expr[1] = (_func_int *)EVar4._vptr_Expr;
    EVar10._vptr_Expr[2] = (_func_int *)puVar6;
    EVar10._vptr_Expr[3] = (_func_int *)puVar7;
    EVar10._vptr_Expr[4] = (_func_int *)puVar8;
    local_78.field_2._M_allocated_capacity = 0;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    *(TokenType *)(EVar10._vptr_Expr + 5) = (TokenType)local_d0._M_p;
    EVar10._vptr_Expr[6] = (_func_int *)(EVar10._vptr_Expr + 8);
    if ((_func_int *)local_f8._M_p == p_Var2) {
      EVar10._vptr_Expr[8] = (_func_int *)auStack_e8._0_8_;
      EVar10._vptr_Expr[9] = (_func_int *)auStack_e8._8_8_;
    }
    else {
      EVar10._vptr_Expr[6] = (_func_int *)local_f8._M_p;
      EVar10._vptr_Expr[8] = (_func_int *)auStack_e8._0_8_;
    }
    EVar10._vptr_Expr[7] = (_func_int *)auVar5;
    local_f0 = (undefined1  [8])0x0;
    auStack_e8._0_8_ = (ulong)(uint7)local_b8._M_allocated_capacity._1_7_ << 8;
    *(col_t *)((long)EVar10._vptr_Expr + 0x54) = (in_RSI->m_previous).col;
    *(line_t *)(EVar10._vptr_Expr + 10) = *plVar1;
    local_f8._M_p = (pointer)p_Var2;
    local_c8._M_p = local_c0 + 8;
    std::
    vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ::~vector((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
               *)&local_78);
    EVar4._vptr_Expr = *(_func_int ***)this;
    *(_func_int ***)this = EVar10._vptr_Expr;
    if (EVar4._vptr_Expr != (_func_int **)0x0) {
      (**(code **)(*EVar4._vptr_Expr + 8))();
    }
    if (local_c8._M_p != local_c0 + 8) {
      operator_delete(local_c8._M_p,
                      CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
    }
    std::
    vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ::~vector(&local_98);
  }
  __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string
            (&local_50,
             (long)local_98.
                   super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.
                   super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_78,"Too many arguments in function call; ",&local_50);
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_100 = (undefined1  [8])*plVar11;
  pCVar12 = (CompileContext *)(plVar11 + 2);
  if (local_100 == (undefined1  [8])pCVar12) {
    local_f0 = (undefined1  [8])(pCVar12->m_source)._M_dataplus._M_p;
    auStack_e8._0_8_ = plVar11[3];
    local_100 = (undefined1  [8])local_f0;
  }
  else {
    local_f0 = (undefined1  [8])(pCVar12->m_source)._M_dataplus._M_p;
  }
  local_f8._M_p = (pointer)plVar11[1];
  *plVar11 = (long)pCVar12;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  errorAt(__return_storage_ptr__,in_RSI,(Token *)&local_d0,(string *)local_100);
  __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecCall() {
        std::unique_ptr<Expr> expr = parsePrecPrimary();

        while (true) {
            if (consume(TokenType::LEFT_PAREN)) {
                std::vector<std::unique_ptr<Expr>> args;
                if (!check(TokenType::RIGHT_PAREN)) {
                    do {
                        args.push_back(parseExpr());
                    } while (consume(TokenType::COMMA));
                }

                expect(TokenType::RIGHT_PAREN, "Expected ')' after function call arguments.");
                Token paren = m_previous;

                if (args.size() > 255) {
                    throw errorAt(paren,
                            "Too many arguments in function call; " +
                            std::to_string(args.size()) +
                            " were provided, max is 255.");
                }

                expr = std::make_unique<CallExpr>(std::move(expr), std::move(args), std::move(paren));
            } else if (consume(TokenType::DOT)) {
                Token dot = m_previous;

                expect(TokenType::IDENTIFIER, "Expected property name after '.'.");
                Token name = m_previous;

                expr = std::make_unique<FieldExpr>(std::move(expr), std::move(name), std::move(dot));
            } else {
                break;
            }
        }

        return expr;
    }